

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFAcroFormDocumentHelper::getOrCreateAcroForm(QPDFAcroFormDocumentHelper *this)

{
  QPDFObjectHandle *oh;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  long in_RSI;
  QPDFObjectHandle QVar5;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long local_58 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  QPDF local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  QPDF local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  QPDF::getRoot((QPDF *)local_78);
  local_68._M_allocated_capacity = (size_type)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"/AcroForm","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_78);
  if ((long *)local_68._M_allocated_capacity != local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,local_58[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  _Var4._M_pi = extraout_RDX;
  if (!bVar3) {
    QPDF::getRoot(&local_28);
    local_68._M_allocated_capacity = (size_type)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"/AcroForm","");
    oh = *(QPDFObjectHandle **)(in_RSI + 8);
    QPDFObjectHandle::newDictionary();
    QPDF::makeIndirectObject(&local_38,oh);
    QVar5 = QPDFObjectHandle::replaceKeyAndGetNew
                      ((QPDFObjectHandle *)local_78,(string *)&local_28,
                       (QPDFObjectHandle *)(local_78 + 0x10));
    uVar2 = local_78._8_8_;
    uVar1 = local_78._0_8_;
    _Var4._M_pi = QVar5.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_78._0_8_ =
         (__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)0x0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_QPDFDocumentHelper).qpdf;
    (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper = (_func_int **)uVar1;
    (this->super_QPDFDocumentHelper).qpdf = (QPDF *)uVar2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var4._M_pi = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      _Var4._M_pi = extraout_RDX_01;
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      _Var4._M_pi = extraout_RDX_02;
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      _Var4._M_pi = extraout_RDX_03;
    }
    if ((long *)local_68._M_allocated_capacity != local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58[0] + 1);
      _Var4._M_pi = extraout_RDX_04;
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      _Var4._M_pi = extraout_RDX_05;
    }
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAcroFormDocumentHelper::getOrCreateAcroForm()
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        acroform = qpdf.getRoot().replaceKeyAndGetNew(
            "/AcroForm", qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
    }
    return acroform;
}